

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O0

void zone_echo(AREA_DATA_conflict *area,char *echo)

{
  AREA_DATA_conflict *in_RDI;
  DESCRIPTOR_DATA *d;
  char buffer [9216];
  DESCRIPTOR_DATA *local_2420;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  char *in_stack_ffffffffffffdbf8;
  char *in_stack_ffffffffffffdc00;
  
  for (local_2420 = descriptor_list; local_2420 != (DESCRIPTOR_DATA *)0x0;
      local_2420 = local_2420->next) {
    if (((local_2420->connected == 0) && (local_2420->character->in_room != (ROOM_INDEX_DATA *)0x0))
       && (local_2420->character->in_room->area == in_RDI)) {
      colorconv(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
      send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
      send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    }
  }
  return;
}

Assistant:

void zone_echo(AREA_DATA *area, char *echo)
{
	char buffer[MSL * 2];

	for (DESCRIPTOR_DATA *d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character->in_room != nullptr && d->character->in_room->area == area)
		{
			colorconv(buffer, echo, d->character);
			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}